

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::MatchSetNode::IsCharTrieArm(MatchSetNode *this,Compiler *compiler,uint *accNumAlts)

{
  size_t sVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  if (((this->isNegation == false) && (sVar1 = (this->set).rep.compact.countPlusOne, sVar1 - 1 < 5))
     && (iVar2 = (int)sVar1 + -1, iVar2 != 0)) {
    uVar3 = iVar2 * *accNumAlts;
    *accNumAlts = uVar3;
    bVar4 = uVar3 < 0x11;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool MatchSetNode::IsCharTrieArm(Compiler& compiler, uint& accNumAlts) const
    {
        if (isNegation || !set.IsCompact())
            return false;
        const uint count = set.Count();
        if(count == 0)
            return false; // empty set always fails and consumes nothing, and therefore is not a char-trie arm
        accNumAlts *= count;
        if (accNumAlts > maxTrieArmExpansion)
            return false;
        return true;
    }